

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void buffer_suite::format_string(void)

{
  basic_variable<std::allocator<char>_> *this;
  iterator iVar1;
  iterator iVar2;
  undefined1 local_65;
  undefined1 local_64 [7];
  value_type expected [1];
  undefined1 local_58 [8];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  result;
  variable data;
  
  this = (basic_variable<std::allocator<char>_> *)((long)&result.field_2 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(this,true);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                *)local_58);
  trial::protocol::bintoken::
  format<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::allocator<char>>
            (this,(basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   *)local_58);
  local_65 = 0x81;
  iVar1 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::begin((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   *)local_58);
  iVar2 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::end((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)local_58);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/format_suite.cpp"
             ,0x23,"void buffer_suite::format_string()",iVar1._M_current,iVar2._M_current,&local_65,
             local_64);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)local_58);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)((long)&result.field_2 + 8));
  return;
}

Assistant:

void format_string()
{
    variable data(true);
    std::basic_string<value_type> result;
    bintoken::format(data, result);
    const value_type expected[] = { bintoken::token::code::true_value };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
}